

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_def_io.c
# Opt level: O0

int32 model_def_read(model_def_t **out_model_def,char *file_name)

{
  char *pcVar1;
  lineiter_t *plVar2;
  int iVar3;
  uint uVar4;
  int32 iVar5;
  FILE *__stream;
  model_def_t *mdef_00;
  model_def_entry_t *pmVar6;
  void *pvVar7;
  acmod_set_t *in_stack_fffffffffffffea8;
  undefined4 uVar8;
  FILE *fp;
  uint32 max_ci_state;
  uint32 max_state;
  uint32 max_tmat;
  uint32 *all_state;
  model_def_entry_t *mdef;
  model_def_t *omd;
  uint32 local_e8;
  uint32 n_total;
  uint32 state [20];
  uint32 local_8c;
  uint32 local_88;
  uint32 n_tied_tmat;
  uint32 n_tied_ci_state;
  uint32 n_tied_state;
  uint32 n_total_map;
  uint32 n_base;
  uint32 n_tri;
  uint32 n_state;
  uint32 tmat;
  acmod_id_t acmod_id;
  uint32 j;
  uint32 i;
  acmod_set_t *acmod_set;
  char tag [32];
  uint32 local_2c;
  lineiter_t *plStack_28;
  uint32 n;
  lineiter_t *li;
  char *file_name_local;
  model_def_t **out_model_def_local;
  
  plStack_28 = (lineiter_t *)0x0;
  li = (lineiter_t *)file_name;
  file_name_local = (char *)out_model_def;
  __stream = fopen(file_name,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                   ,0x19d,"Unable to open %s for reading",li);
    out_model_def_local._4_4_ = -1;
  }
  else {
    plStack_28 = lineiter_start_clean((FILE *)__stream);
    if (plStack_28 == (lineiter_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
              ,0x1a6,"ERROR not even a version number in %s!?\n",li);
      fclose(__stream);
      lineiter_free(plStack_28);
      out_model_def_local._4_4_ = -1;
    }
    else {
      iVar3 = strcmp(plStack_28->buf,"0.3");
      plVar2 = li;
      if (iVar3 == 0) {
        local_8c = 0xffffffff;
        local_88 = 0xffffffff;
        n_tied_tmat = 0xffffffff;
        n_tied_ci_state = 0xffffffff;
        n_tied_state = 0xffffffff;
        n_total_map = 0xffffffff;
        for (acmod_id = 0; acmod_id < 6; acmod_id = acmod_id + 1) {
          plStack_28 = lineiter_next(plStack_28);
          if (plStack_28 == (lineiter_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                    ,0x1c5,"Incomplete count information in %s!?\n",li);
            fclose(__stream);
            lineiter_free(plStack_28);
            return -1;
          }
          __isoc99_sscanf(plStack_28->buf,"%u %s",&local_2c,&acmod_set);
          iVar3 = strcmp((char *)&acmod_set,"n_base");
          if (iVar3 == 0) {
            n_tied_state = local_2c;
          }
          else {
            iVar3 = strcmp((char *)&acmod_set,"n_tri");
            if (iVar3 == 0) {
              n_total_map = local_2c;
            }
            else {
              iVar3 = strcmp((char *)&acmod_set,"n_state_map");
              if (iVar3 == 0) {
                n_tied_ci_state = local_2c;
              }
              else {
                iVar3 = strcmp((char *)&acmod_set,"n_tied_state");
                if (iVar3 == 0) {
                  n_tied_tmat = local_2c;
                }
                else {
                  iVar3 = strcmp((char *)&acmod_set,"n_tied_ci_state");
                  if (iVar3 == 0) {
                    local_88 = local_2c;
                  }
                  else {
                    iVar3 = strcmp((char *)&acmod_set,"n_tied_tmat");
                    if (iVar3 != 0) {
                      uVar4 = lineiter_lineno(plStack_28);
                      err_msg(ERR_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                              ,0x1e2,"Unknown tag %s in file at line %d\n",&acmod_set,(ulong)uVar4);
                      fclose(__stream);
                      lineiter_free(plStack_28);
                      return -1;
                    }
                    local_8c = local_2c;
                  }
                }
              }
            }
          }
        }
        plStack_28 = lineiter_next(plStack_28);
        mdef_00 = (model_def_t *)
                  __ckd_calloc__(1,0x48,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                 ,0x1ec);
        *(model_def_t **)file_name_local = mdef_00;
        _j = acmod_set_new();
        mdef_00->acmod_set = _j;
        acmod_set_set_n_ci_hint(_j,n_tied_state);
        acmod_set_set_n_tri_hint(_j,n_total_map);
        uVar4 = n_tied_state + n_total_map;
        pmVar6 = (model_def_entry_t *)
                 __ckd_calloc__((ulong)uVar4,0x20,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                ,0x1f5);
        mdef_00->defn = pmVar6;
        mdef_00->n_total_state = n_tied_ci_state;
        pvVar7 = __ckd_calloc__((ulong)n_tied_ci_state,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                                ,0x1f8);
        mdef_00->n_tied_ci_state = local_88;
        mdef_00->n_tied_state = n_tied_tmat;
        mdef_00->n_tied_tmat = local_8c;
        mdef_00->max_n_state = 0;
        mdef_00->min_n_state = 0x14;
        tmat = 0;
        for (acmod_id = 0; acmod_id < n_tied_state; acmod_id = acmod_id + 1) {
          n_base = 0x14;
          pcVar1 = plStack_28->buf;
          iVar3 = lineiter_lineno(plStack_28);
          in_stack_fffffffffffffea8 = _j;
          iVar5 = parse_base_line(pcVar1,iVar3,&n_state,&n_tri,&local_e8,&n_base,_j);
          if (iVar5 != 0) {
            fclose(__stream);
            lineiter_free(plStack_28);
            return -1;
          }
          pmVar6[acmod_id].p = n_state;
          pmVar6[acmod_id].tmat = n_tri;
          pmVar6[acmod_id].n_state = n_base;
          pmVar6[acmod_id].state = (uint32 *)((long)pvVar7 + (ulong)tmat * 4);
          memcpy(pmVar6[acmod_id].state,&local_e8,(ulong)n_base << 2);
          update_totals(mdef_00,pmVar6 + acmod_id);
          plStack_28 = lineiter_next(plStack_28);
          tmat = n_base + tmat;
        }
        for (; uVar8 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20), acmod_id < uVar4;
            acmod_id = acmod_id + 1) {
          n_base = 0x14;
          pcVar1 = plStack_28->buf;
          iVar3 = lineiter_lineno(plStack_28);
          in_stack_fffffffffffffea8 = _j;
          iVar5 = parse_tri_line(pcVar1,iVar3,&n_state,&n_tri,&local_e8,&n_base,_j);
          if (iVar5 != 0) {
            fclose(__stream);
            lineiter_free(plStack_28);
            return -1;
          }
          pmVar6[acmod_id].p = n_state;
          pmVar6[acmod_id].tmat = n_tri;
          pmVar6[acmod_id].n_state = n_base;
          pmVar6[acmod_id].state = (uint32 *)((long)pvVar7 + (ulong)tmat * 4);
          memcpy(pmVar6[acmod_id].state,&local_e8,(ulong)n_base << 2);
          update_totals(mdef_00,pmVar6 + acmod_id);
          plStack_28 = lineiter_next(plStack_28);
          tmat = n_base + tmat;
        }
        mdef_00->n_defn = uVar4;
        if (tmat != n_tied_ci_state) {
          __assert_fail("j == n_total_map",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                        ,0x23b,"int32 model_def_read(model_def_t **, const char *)");
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x23d,"Model definition info:\n");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x23e,"%u total models defined (%u base, %u tri)\n",(ulong)mdef_00->n_defn,
                (ulong)n_tied_state,CONCAT44(uVar8,n_total_map));
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x23f,"%u total states\n",(ulong)mdef_00->n_total_state);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x240,"%u total tied states\n",(ulong)mdef_00->n_tied_state);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x241,"%u total tied CI states\n",(ulong)mdef_00->n_tied_ci_state);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x242,"%u total tied transition matrices\n",(ulong)mdef_00->n_tied_tmat);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x243,"%u max state/model\n",(ulong)mdef_00->max_n_state);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x244,"%u min state/model\n",(ulong)mdef_00->min_n_state);
        fclose(__stream);
        lineiter_free(plStack_28);
        out_model_def_local._4_4_ = 0;
      }
      else {
        pcVar1 = plStack_28->buf;
        iVar3 = lineiter_lineno(plStack_28);
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                ,0x1b0,"ERROR version(%s) == \"%s\", but expected %s at line %d.\n",plVar2,pcVar1,
                "0.3",iVar3);
        fclose(__stream);
        iVar3 = strcmp(plStack_28->buf,"0.1");
        if (iVar3 == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                  ,0x1b5,
                  "You must add an attribute field to all the model records.  See SPHINX-III File Formats manual\n"
                 );
        }
        iVar3 = strcmp(plStack_28->buf,"0.2");
        if (iVar3 == 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/model_def_io.c"
                  ,0x1b9,
                  "You must add n_tied_state, n_tied_ci_state and n_tied_tmat definitions at the head of the file.  See /net/alf19/usr2/eht/s3/cvtmdef.csh\n"
                 );
        }
        lineiter_free(plStack_28);
        out_model_def_local._4_4_ = -1;
      }
    }
  }
  return out_model_def_local._4_4_;
}

Assistant:

int32
model_def_read(model_def_t **out_model_def,
	       const char *file_name)
{
    lineiter_t *li = NULL;
    uint32 n;
    char tag[32];
    acmod_set_t *acmod_set;
    uint32 i, j;
    acmod_id_t acmod_id;
    uint32 tmat;
    uint32 n_state;
    uint32 n_tri;
    uint32 n_base;
    uint32 n_total_map;
    uint32 n_tied_state;
    uint32 n_tied_ci_state;
    uint32 n_tied_tmat;
    uint32 state[MAX_N_STATE];
    uint32 n_total;
    model_def_t *omd;
    model_def_entry_t *mdef;
    uint32 *all_state;
    uint32 max_tmat;
    uint32 max_state;
    uint32 max_ci_state;
    
    FILE *fp;

    fp = fopen(file_name, "r");
    if (fp == NULL) {
	E_ERROR_SYSTEM("Unable to open %s for reading",
		      file_name);

	return S3_ERROR;
    }
    
    li = lineiter_start_clean(fp);

    if (li == NULL) {
	E_ERROR("ERROR not even a version number in %s!?\n",
		file_name);

	fclose(fp);

        lineiter_free(li);
	return S3_ERROR;
    }

    if (strcmp(li->buf, MODEL_DEF_VERSION) != 0) {
	E_ERROR("ERROR version(%s) == \"%s\", but expected %s at line %d.\n",
		file_name, li->buf, MODEL_DEF_VERSION, lineiter_lineno(li));

	fclose(fp);
	
	if (strcmp(li->buf, "0.1") == 0) {
	    E_ERROR("You must add an attribute field to all the model records.  See SPHINX-III File Formats manual\n");
	}
	
	if (strcmp(li->buf, "0.2") == 0) {
	    E_ERROR("You must add n_tied_state, n_tied_ci_state and n_tied_tmat definitions at the head of the file.  See /net/alf19/usr2/eht/s3/cvtmdef.csh\n");
	}
	
        lineiter_free(li);
	return S3_ERROR;
    }

    n_tri = n_base = n_total_map = n_tied_state = n_tied_ci_state = n_tied_tmat = NO_NUMBER;
    for ( i = 0; i < 6; i++) {
        li = lineiter_next(li);
        if (li == NULL) {
	    E_ERROR("Incomplete count information in %s!?\n",
		    file_name);
	    
	    fclose(fp);
            lineiter_free(li);
	    return S3_ERROR;
	}

	sscanf(li->buf, "%u %s", &n, tag);

	if (strcmp(tag, "n_base") == 0) {
	    n_base = n;
	}	
	else if (strcmp(tag, "n_tri") == 0) {
	    n_tri = n;
	}
	else if (strcmp(tag, "n_state_map") == 0) {
	    n_total_map = n;
	}
	else if (strcmp(tag, "n_tied_state") == 0) {
	    n_tied_state = n;
	}
	else if (strcmp(tag, "n_tied_ci_state") == 0) {
	    n_tied_ci_state = n;
	}
	else if (strcmp(tag, "n_tied_tmat") == 0) {
	    n_tied_tmat = n;
	}
	else {
	    E_ERROR("Unknown tag %s in file at line %d\n",
		    tag, lineiter_lineno(li));
	    	    
	    fclose(fp);

            lineiter_free(li);
	    return S3_ERROR;
	}
    }
    li = lineiter_next(li);

    *out_model_def = omd = ckd_calloc(1, sizeof(model_def_t));
    omd->acmod_set = acmod_set = acmod_set_new();

    /* give the acmod_set module some storage allocation requirements */
    acmod_set_set_n_ci_hint(acmod_set, n_base);
    acmod_set_set_n_tri_hint(acmod_set, n_tri);

    n_total = n_base + n_tri;

    omd->defn = mdef = ckd_calloc(n_total, sizeof(model_def_entry_t));
    omd->n_total_state = n_total_map;

    all_state = ckd_calloc(n_total_map, sizeof(uint32));
    
    omd->n_tied_ci_state = n_tied_ci_state;
    omd->n_tied_state = n_tied_state;
    omd->n_tied_tmat = n_tied_tmat;

    omd->max_n_state = 0;
    omd->min_n_state = MAX_N_STATE;

    for (i = 0, j = 0, max_state = 0, max_ci_state = 0, max_tmat = 0;
	 i < n_base; i++, j += n_state) {
	n_state = MAX_N_STATE;
	if (parse_base_line(li->buf,
			    lineiter_lineno(li),
	                    &acmod_id,
			    &tmat,
			    state,
			    &n_state,
			    acmod_set) != S3_SUCCESS) {

	    fclose(fp);
            lineiter_free(li);
            return S3_ERROR;
	}

	mdef[i].p = acmod_id;
	mdef[i].tmat = tmat;
	mdef[i].n_state = n_state;
	mdef[i].state = &all_state[j];

	memcpy((char *)mdef[i].state, (const char *)state,
	       n_state * sizeof(uint32));

	update_totals(omd, &mdef[i]);

	li = lineiter_next(li);
    }

    for (; i < n_total; i++, j += n_state) {
	n_state = MAX_N_STATE;

	if (parse_tri_line(li->buf,
			   lineiter_lineno(li),
			   &acmod_id,
			   &tmat,
			   state,
			   &n_state,
			   acmod_set) != S3_SUCCESS) {
	    fclose(fp);
            lineiter_free(li);
	    return S3_ERROR;
	}

	mdef[i].p = acmod_id;
	mdef[i].tmat = tmat;
	mdef[i].n_state = n_state;
	mdef[i].state = &all_state[j];
	memcpy((char *)mdef[i].state,
	       (const char *)state,
	       n_state * sizeof(uint32));

	update_totals(omd, &mdef[i]);
	li = lineiter_next(li);
    }

    omd->n_defn = n_total;

    assert(j == n_total_map);
    
    E_INFO("Model definition info:\n");
    E_INFO("%u total models defined (%u base, %u tri)\n", omd->n_defn, n_base, n_tri);
    E_INFO("%u total states\n", omd->n_total_state);
    E_INFO("%u total tied states\n", omd->n_tied_state);
    E_INFO("%u total tied CI states\n", omd->n_tied_ci_state);
    E_INFO("%u total tied transition matrices\n", omd->n_tied_tmat);
    E_INFO("%u max state/model\n", omd->max_n_state);
    E_INFO("%u min state/model\n", omd->min_n_state);

    fclose(fp);

    lineiter_free(li);
    return S3_SUCCESS;
}